

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCProfile.cpp
# Opt level: O0

void Assimp::IFC::ProcessPolyLine(IfcPolyline *def,TempMesh *meshout,ConversionData *param_3)

{
  bool bVar1;
  undefined1 *this;
  Lazy *this_00;
  size_type sVar2;
  value_type_conflict local_5c;
  IfcCartesianPoint *local_58;
  IfcCartesianPoint *cp;
  const_iterator __end2;
  const_iterator __begin2;
  ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>,_2UL,_0UL> *__range2;
  IfcVector3 t;
  ConversionData *param_2_local;
  TempMesh *meshout_local;
  IfcPolyline *def_local;
  
  t.z = (double)param_3;
  aiVector3t<double>::aiVector3t((aiVector3t<double> *)&__range2);
  this = &(def->super_IfcBoundedCurve).field_0x50;
  __end2 = std::
           vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>_>_>
           ::begin((vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>_>_>
                    *)this);
  cp = (IfcCartesianPoint *)
       std::
       vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>_>_>
       ::end((vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>_>_>
              *)this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>_*,_std::vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>_>_>_>
                                *)&cp);
    if (!bVar1) break;
    this_00 = (Lazy *)__gnu_cxx::
                      __normal_iterator<const_Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>_*,_std::vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>_>_>_>
                      ::operator*(&__end2);
    local_58 = STEP::Lazy::operator_cast_to_IfcCartesianPoint_(this_00);
    ConvertCartesianPoint((IfcVector3 *)&__range2,local_58);
    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
              (&meshout->mVerts,(value_type *)&__range2);
    __gnu_cxx::
    __normal_iterator<const_Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>_*,_std::vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>_>_>_>
    ::operator++(&__end2);
  }
  sVar2 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size
                    (&meshout->mVerts);
  local_5c = (value_type_conflict)sVar2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&meshout->mVertcnt,&local_5c);
  return;
}

Assistant:

void ProcessPolyLine(const Schema_2x3::IfcPolyline& def, TempMesh& meshout, ConversionData& /*conv*/)
{
    // this won't produce a valid mesh, it just spits out a list of vertices
    IfcVector3 t;
    for(const Schema_2x3::IfcCartesianPoint& cp : def.Points) {
        ConvertCartesianPoint(t,cp);
        meshout.mVerts.push_back(t);
    }
    meshout.mVertcnt.push_back(static_cast<unsigned int>(meshout.mVerts.size()));
}